

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

int array_getfields(t_symbol *elemtemplatesym,_glist **elemtemplatecanvasp,
                   t_template **elemtemplatep,int *elemsizep,_fielddesc *xfielddesc,
                   _fielddesc *yfielddesc,_fielddesc *wfielddesc,int *xonsetp,int *yonsetp,
                   int *wonsetp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  t_template *x;
  t_symbol *ptVar4;
  char *pcVar5;
  char *fmt;
  int type;
  int xonset;
  int yonset;
  t_symbol *dummy;
  _glist *local_50;
  int *local_48;
  t_template **local_40;
  int wonset;
  
  local_40 = elemtemplatep;
  x = template_findbyname(elemtemplatesym);
  if (x == (t_template *)0x0) {
    pcVar5 = elemtemplatesym->s_name;
    fmt = "plot: %s: no such template";
LAB_0015386e:
    pd_error((void *)0x0,fmt,pcVar5);
    iVar2 = -1;
  }
  else {
    if (elemtemplatesym == &s_float) {
      local_50 = (_glist *)0x0;
    }
    else if ((x->t_list == (_gtemplate *)0x0) ||
            (local_50 = x->t_list->x_owner, local_50 == (_glist *)0x0)) {
      pcVar5 = elemtemplatesym->s_name;
      fmt = "plot: %s: no canvas for this template";
      goto LAB_0015386e;
    }
    iVar1 = x->t_n;
    local_48 = elemsizep;
    if ((yfielddesc == (_fielddesc *)0x0) || (yfielddesc->fd_var == '\0')) {
      ptVar4 = gensym("y");
    }
    else {
      ptVar4 = (yfielddesc->fd_un).fd_symbol;
    }
    iVar2 = template_find_field(x,ptVar4,&yonset,&type,&dummy);
    if ((iVar2 == 0) || (type != 0)) {
      yonset = -1;
    }
    if ((xfielddesc == (_fielddesc *)0x0) || (xfielddesc->fd_var == '\0')) {
      ptVar4 = gensym("x");
    }
    else {
      ptVar4 = (xfielddesc->fd_un).fd_symbol;
    }
    iVar2 = template_find_field(x,ptVar4,&xonset,&type,&dummy);
    if ((iVar2 == 0) || (type != 0)) {
      xonset = -1;
    }
    if ((wfielddesc == (_fielddesc *)0x0) || (wfielddesc->fd_var == '\0')) {
      ptVar4 = gensym("w");
    }
    else {
      ptVar4 = (wfielddesc->fd_un).fd_symbol;
    }
    iVar3 = template_find_field(x,ptVar4,&wonset,&type,&dummy);
    iVar2 = 0;
    *elemtemplatecanvasp = local_50;
    *local_40 = x;
    *local_48 = iVar1 << 3;
    *xonsetp = xonset;
    *yonsetp = yonset;
    *wonsetp = -(uint)(type != 0) | wonset | -(uint)(iVar3 == 0);
  }
  return iVar2;
}

Assistant:

int array_getfields(t_symbol *elemtemplatesym,
    t_canvas **elemtemplatecanvasp,
    t_template **elemtemplatep, int *elemsizep,
    t_fielddesc *xfielddesc, t_fielddesc *yfielddesc, t_fielddesc *wfielddesc,
    int *xonsetp, int *yonsetp, int *wonsetp)
{
    int arrayonset, elemsize, yonset, wonset, xonset, type;
    t_template *elemtemplate;
    t_symbol *dummy, *varname;
    t_canvas *elemtemplatecanvas = 0;

        /* the "float" template is special in not having to have a canvas;
        template_findbyname is hardwired to return a predefined
        template. */

    if (!(elemtemplate =  template_findbyname(elemtemplatesym)))
    {
        pd_error(0, "plot: %s: no such template", elemtemplatesym->s_name);
        return (-1);
    }
    if (!((elemtemplatesym == &s_float) ||
        (elemtemplatecanvas = template_findcanvas(elemtemplate))))
    {
        pd_error(0, "plot: %s: no canvas for this template", elemtemplatesym->s_name);
        return (-1);
    }
    elemsize = elemtemplate->t_n * sizeof(t_word);
    if (yfielddesc && yfielddesc->fd_var)
        varname = yfielddesc->fd_un.fd_varsym;
    else varname = gensym("y");
    if (!template_find_field(elemtemplate, varname, &yonset, &type, &dummy)
        || type != DT_FLOAT)
            yonset = -1;
    if (xfielddesc && xfielddesc->fd_var)
        varname = xfielddesc->fd_un.fd_varsym;
    else varname = gensym("x");
    if (!template_find_field(elemtemplate, varname, &xonset, &type, &dummy)
        || type != DT_FLOAT)
            xonset = -1;
    if (wfielddesc && wfielddesc->fd_var)
        varname = wfielddesc->fd_un.fd_varsym;
    else varname = gensym("w");
    if (!template_find_field(elemtemplate, varname, &wonset, &type, &dummy)
        || type != DT_FLOAT)
            wonset = -1;

        /* fill in slots for return values */
    *elemtemplatecanvasp = elemtemplatecanvas;
    *elemtemplatep = elemtemplate;
    *elemsizep = elemsize;
    *xonsetp = xonset;
    *yonsetp = yonset;
    *wonsetp = wonset;
    return (0);
}